

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  seqStore_t *seqStorePtr;
  uint *count;
  void *pvVar1;
  ZSTD_compressedBlockState_t *pZVar2;
  int iVar3;
  int iVar4;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ZSTD_sequenceLength ZVar9;
  void *__src;
  U32 UVar10;
  BYTE *pBVar11;
  long lVar12;
  seqDef *sequences;
  uint uVar13;
  size_t err_code_1;
  seqDef *psVar14;
  long lVar15;
  ZSTD_entropyCTablesMetadata_t *pZVar16;
  undefined4 in_register_0000008c;
  ulong uVar17;
  size_t total;
  size_t __n;
  uint uVar18;
  uint uVar19;
  U32 UVar20;
  BYTE *pBVar21;
  bool bVar22;
  size_t in_stack_fffffffffffffda8;
  int litEntropyWritten;
  uint uStack_24c;
  U32 local_248;
  int seqEntropyWritten;
  BYTE *local_240;
  BYTE *local_238;
  ulong local_230;
  ulong local_228;
  void *local_220;
  ZSTD_compressedBlockState_t *local_218;
  BYTE *local_210;
  long local_208;
  void *local_200;
  BYTE *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  seqDef *local_1e0;
  ZSTD_compressedBlockState_t *local_1d8;
  seqDef *local_1d0;
  BYTE *local_1c8;
  undefined8 local_1c0;
  BYTE *local_1b8;
  ulong local_1b0;
  long local_1a8;
  ulong local_1a0;
  ZSTD_entropyCTablesMetadata_t *local_198;
  ulong local_190;
  ZSTD_CCtx_params *local_188;
  ulong local_180;
  seqDef *local_178;
  long local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1c0 = CONCAT44(in_register_0000008c,lastBlock);
  seqStorePtr = &zc->seqStore;
  local_188 = &zc->appliedParams;
  pZVar16 = &entropyMetadata;
  local_1b8 = (BYTE *)srcSize;
  sVar5 = ZSTD_buildBlockEntropyStats
                    (seqStorePtr,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,local_188,pZVar16,zc->entropyWorkspace,
                     0x22d8);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  sequences = (zc->seqStore).sequencesStart;
  local_1e0 = (zc->seqStore).sequences;
  sVar5 = (long)local_1e0 - (long)sequences >> 3;
  local_238 = (zc->seqStore).litStart;
  local_1c8 = (zc->seqStore).lit;
  pBVar21 = local_1c8 + -(long)local_238;
  local_208 = dstCapacity + (long)dst;
  uVar17 = (zc->appliedParams).targetCBlockSize;
  local_230 = 0x53c;
  if (0x53c < uVar17) {
    local_230 = uVar17;
  }
  local_228 = (ulong)(entropyMetadata.hufMetadata.hType == set_compressed);
  local_1d8 = (zc->blockState).prevCBlock;
  local_218 = (zc->blockState).nextCBlock;
  local_190 = (ulong)(uint)zc->bmi2;
  local_1e8 = (zc->seqStore).llCode;
  local_1f0 = (zc->seqStore).mlCode;
  local_1f8 = (zc->seqStore).ofCode;
  local_220 = src;
  local_210 = (BYTE *)dst;
  local_1d0 = sequences;
  if (local_1e0 == sequences) {
    local_230 = 1;
    local_200 = src;
  }
  else {
    count = zc->entropyWorkspace;
    _litEntropyWritten = CONCAT44(uStack_24c,0xff);
    local_240 = pBVar21;
    if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
      sVar6 = HIST_count_wksp(count,(uint *)&litEntropyWritten,local_238,(size_t)pBVar21,count,
                              0x22d8);
      if (sVar6 < 0xffffffffffffff89) {
        sVar6 = HUF_estimateCompressedSize((HUF_CElt *)local_218,count,litEntropyWritten);
        if (entropyMetadata.hufMetadata.hType != set_compressed) {
          entropyMetadata.hufMetadata.hufDesSize = 0;
        }
        local_240 = (BYTE *)(entropyMetadata.hufMetadata.hufDesSize + sVar6 + 3);
      }
    }
    else if (entropyMetadata.hufMetadata.hType != set_basic) {
      if (entropyMetadata.hufMetadata.hType == set_rle) {
        local_240 = (BYTE *)0x1;
      }
      else {
        local_240 = (BYTE *)0x0;
      }
    }
    pZVar2 = local_218;
    sVar6 = ZSTD_estimateSubBlockSize_symbolType
                      (entropyMetadata.fseMetadata.ofType,local_1f8,0x1f,sVar5,
                       (local_218->entropy).fse.offcodeCTable,(U8 *)0x0,(short *)OF_defaultNorm,5,
                       0x1c,count,in_stack_fffffffffffffda8);
    sVar7 = ZSTD_estimateSubBlockSize_symbolType
                      (entropyMetadata.fseMetadata.llType,local_1e8,0x23,sVar5,
                       (pZVar2->entropy).fse.litlengthCTable,LL_bits,(short *)LL_defaultNorm,6,0x23,
                       count,in_stack_fffffffffffffda8);
    sVar8 = ZSTD_estimateSubBlockSize_symbolType
                      (entropyMetadata.fseMetadata.mlType,local_1f0,0x34,sVar5,
                       (pZVar2->entropy).fse.matchlengthCTable,ML_bits,(short *)ML_defaultNorm,6,
                       0x34,count,in_stack_fffffffffffffda8);
    pBVar11 = local_240 + entropyMetadata.fseMetadata.fseTablesSize + sVar8 + sVar7 + sVar6 + 6;
    if (local_1c8 == local_238) {
      local_198 = (ZSTD_entropyCTablesMetadata_t *)0x100;
    }
    else {
      local_198 = (ZSTD_entropyCTablesMetadata_t *)((ulong)((long)local_240 << 8) / (ulong)pBVar21);
    }
    local_1a0 = (ulong)(((long)pBVar11 - (long)local_240) * 0x100) / sVar5;
    uVar17 = (ulong)(pBVar11 + (local_230 >> 1)) / local_230 +
             (ulong)((ulong)(pBVar11 + (local_230 >> 1)) / local_230 == 0);
    local_1b0 = (ulong)((long)pBVar11 * 0x100) / uVar17;
    if (local_1b8 < pBVar11) {
      return 0;
    }
    local_230 = 1;
    local_1a8 = uVar17 - 1;
    local_180 = local_1a0 + 0x7800;
    lVar15 = 0;
    local_200 = local_220;
    sequences = local_1d0;
    dst = local_210;
    while( true ) {
      sVar5 = (long)local_1e0 - (long)sequences >> 3;
      if (lVar15 == local_1a8) break;
      uVar17 = local_1a0;
      if (lVar15 == 0) {
        uVar17 = local_180;
      }
      uVar17 = uVar17 + (long)local_198 * (ulong)sequences->litLength;
      sVar6 = 1;
      if (uVar17 <= local_1b0) {
        lVar12 = (ulong)sequences->litLength + (ulong)sequences->mlBase + 3;
        sVar8 = sVar5 + (sVar5 == 0);
        for (sVar7 = 1; sVar6 = sVar8, sVar8 != sVar7; sVar7 = sVar7 + 1) {
          uVar17 = uVar17 + local_1a0 + (long)local_198 * (ulong)sequences[sVar7].litLength;
          lVar12 = lVar12 + (ulong)sequences[sVar7].litLength + (ulong)sequences[sVar7].mlBase + 3;
          if ((local_1b0 < uVar17) && (sVar6 = sVar7, uVar17 < (ulong)(lVar12 * 0x100))) break;
        }
      }
      if (sequences + sVar6 == local_1e0) break;
      _litEntropyWritten = _litEntropyWritten & 0xffffffff00000000;
      seqEntropyWritten = 0;
      sVar7 = 0;
      psVar14 = sequences;
      pZVar16 = local_198;
      sVar5 = sVar6;
      local_240 = (BYTE *)dst;
      local_178 = sequences + sVar6;
      local_170 = lVar15;
      while (bVar22 = sVar5 != 0, sVar5 = sVar5 - 1, bVar22) {
        ZVar9 = ZSTD_getSequenceLength(seqStorePtr,psVar14);
        sVar7 = sVar7 + ((ulong)ZVar9 & 0xffffffff);
        psVar14 = psVar14 + 1;
      }
      sVar5 = ZSTD_seqDecompressedSize(seqStorePtr,sequences,sVar6,sVar7,(int)pZVar16);
      dst = local_240;
      sVar8 = ZSTD_compressSubBlock
                        (&local_218->entropy,&entropyMetadata,sequences,sVar6,local_238,sVar7,
                         local_1e8,local_1f0,local_1f8,local_188,local_240,
                         local_208 - (long)local_240,(int)local_190,(int)local_228,(int)local_230,
                         &litEntropyWritten,&seqEntropyWritten,0);
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      if ((sVar8 != 0) && (sVar8 < sVar5)) {
        local_200 = (void *)((long)local_200 + sVar5);
        local_238 = local_238 + sVar7;
        dst = (void *)((long)dst + sVar8);
        local_1e8 = local_1e8 + sVar6;
        local_1f0 = local_1f0 + sVar6;
        local_1f8 = local_1f8 + sVar6;
        local_228 = local_228 & 0xffffffff;
        if (litEntropyWritten != 0) {
          local_228 = 0;
        }
        local_230 = local_230 & 0xffffffff;
        sequences = local_178;
        if (seqEntropyWritten != 0) {
          local_230 = 0;
        }
      }
      lVar15 = local_170 + 1;
    }
    pBVar21 = local_1c8 + -(long)local_238;
    pZVar16 = local_198;
  }
  pBVar11 = local_238;
  _litEntropyWritten = (ulong)uStack_24c << 0x20;
  seqEntropyWritten = 0;
  local_238 = (BYTE *)ZSTD_seqDecompressedSize
                                (seqStorePtr,sequences,sVar5,(size_t)pBVar21,(int)pZVar16);
  iVar4 = (int)local_230;
  sVar6 = ZSTD_compressSubBlock
                    (&local_218->entropy,&entropyMetadata,sequences,sVar5,pBVar11,(size_t)pBVar21,
                     local_1e8,local_1f0,local_1f8,local_188,dst,local_208 - (long)dst,
                     (int)local_190,(int)local_228,iVar4,&litEntropyWritten,&seqEntropyWritten,
                     (U32)local_1c0);
  pBVar21 = local_210;
  pvVar1 = local_220;
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  __src = local_200;
  local_240 = (BYTE *)dst;
  if ((sVar6 != 0) && (sVar6 < local_238)) {
    __src = (void *)((long)local_200 + (long)local_238);
    local_240 = (BYTE *)((long)dst + sVar6);
    iVar3 = 0;
    if (seqEntropyWritten == 0) {
      iVar3 = iVar4;
    }
    iVar4 = iVar3;
    sequences = sequences + sVar5;
    if (litEntropyWritten != 0) goto LAB_01f96232;
  }
  if ((U32)local_228 != 0) {
    switchD_01939fa4::default(local_218,local_1d8,0x810);
  }
LAB_01f96232:
  pBVar11 = local_240;
  if ((iVar4 != 0) &&
     (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
       (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
      (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
    return 0;
  }
  if (__src < (void *)((long)pvVar1 + (long)local_1b8)) {
    __n = ((long)pvVar1 + (long)local_1b8) - (long)__src;
    uVar17 = __n + 3;
    if ((ulong)(local_208 - (long)local_240) < uVar17) {
      return 0xffffffffffffffba;
    }
    iVar4 = (int)local_1c0 + (int)__n * 8;
    *(short *)local_240 = (short)iVar4;
    local_240[2] = (BYTE)((uint)iVar4 >> 0x10);
    switchD_01939fa4::default(local_240 + 3,__src,__n);
    if (0xffffffffffffff88 < uVar17) {
      return uVar17;
    }
    local_240 = pBVar11 + uVar17;
    if (sequences < local_1e0) {
      uVar17 = *(ulong *)local_1d8->rep;
      UVar10 = local_1d8->rep[2];
      uStack_24c = (uint)(uVar17 >> 0x20);
      uVar13 = uStack_24c;
      _litEntropyWritten = uVar17;
      local_248 = UVar10;
      for (psVar14 = local_1d0; psVar14 < sequences; psVar14 = psVar14 + 1) {
        uVar18 = psVar14->offBase;
        UVar20 = (U32)uVar17;
        if (uVar18 < 4) {
          local_228 = CONCAT44(local_228._4_4_,UVar10);
          ZVar9 = ZSTD_getSequenceLength(seqStorePtr,psVar14);
          uVar19 = (uVar18 + (ZVar9.litLength == 0)) - 1;
          UVar10 = (U32)local_228;
          if (uVar19 != 0) {
            if (uVar19 == 3) {
              uVar18 = UVar20 - 1;
            }
            else {
              uVar18 = (&litEntropyWritten)[uVar19];
            }
            local_248 = uVar13;
            if (uVar19 == 1) {
              local_248 = (U32)local_228;
            }
            goto LAB_01f9638e;
          }
        }
        else {
          uVar18 = uVar18 - 3;
          local_248 = uVar13;
LAB_01f9638e:
          _litEntropyWritten = CONCAT44(UVar20,uVar18);
          uVar17 = (ulong)uVar18;
          UVar10 = local_248;
          uVar13 = UVar20;
        }
      }
      local_218->rep[2] = local_248;
      *(ulong *)local_218->rep = _litEntropyWritten;
      pBVar21 = local_210;
    }
  }
  return (long)local_240 - (long)pBVar21;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               unsigned lastBlock)
{
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}